

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void parse_preshader(Context *ctx,uint32 *tokens,uint32 tokcount)

{
  uint32 *puVar1;
  uint32 okay_version;
  uint32 uVar2;
  uint uVar3;
  MOJOSHADER_free p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  MOJOSHADER_symbol *pMVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  MOJOSHADER_preshader *pMVar15;
  double *pdVar16;
  MOJOSHADER_preshaderInstruction *pMVar17;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  float *__s;
  MOJOSHADER_preshaderOpcode MVar21;
  uint32 *puVar22;
  ulong uVar23;
  ulong uVar24;
  MOJOSHADER_preshaderOperand *pMVar25;
  char *pcVar26;
  uint uVar27;
  int iVar28;
  uint32 *puVar29;
  ulong uVar30;
  uint uVar31;
  bool bVar32;
  uint32 *local_90;
  uint local_88;
  int local_84;
  uint32 *local_68;
  uint32 *local_60;
  ulong local_58;
  ulong local_50;
  CtabData ctabdata;
  
  if (ctx->have_preshader != 0) {
    __assert_fail("ctx->have_preshader == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x29c0,"void parse_preshader(Context *, const uint32 *, uint32)");
  }
  ctx->have_preshader = 1;
  okay_version = *tokens;
  if (okay_version + 0xb9a7fdfe < 0xfffffffe) {
    pcVar26 = "Unsupported preshader version.";
  }
  else {
    puVar29 = tokens + 1;
    bVar7 = false;
    local_58 = 0;
    local_60 = (uint32 *)0x0;
    bVar5 = false;
    local_84 = 0;
    local_68 = (uint32 *)0x0;
    bVar6 = false;
    local_88 = 0;
    local_90 = (uint32 *)0x0;
    bVar32 = false;
    local_50 = 0;
    puVar22 = (uint32 *)0x0;
    for (uVar31 = tokcount - 1; uVar31 != 0; uVar31 = uVar31 + ~ctabdata.have_ctab) {
      ctabdata._0_8_ = ctabdata._0_8_ & 0xffffffff00000000;
      iVar13 = is_comment_token(ctx,*puVar29,(uint32 *)&ctabdata);
      if (iVar13 == 0) {
LAB_0010b7a8:
        pcVar26 = "Bogus preshader data.";
        goto LAB_0010b7b2;
      }
      if (uVar31 < (uint)ctabdata.have_ctab) goto LAB_0010b7a8;
      bVar9 = bVar32;
      bVar10 = bVar5;
      bVar11 = bVar6;
      bVar12 = bVar7;
      if (ctabdata.have_ctab != 0) {
        puVar1 = puVar29 + 1;
        uVar2 = *puVar1;
        if (uVar2 == 0x54494c43) {
          local_58 = ctabdata._0_8_ & 0xffffffff;
          local_60 = puVar1;
          bVar12 = true;
          if (bVar7) {
            pcVar26 = "Multiple CLIT preshader blocks.";
            goto LAB_0010b7b2;
          }
        }
        else if (uVar2 == 0x434c5846) {
          local_84 = ctabdata.have_ctab;
          local_68 = puVar1;
          bVar10 = true;
          if (bVar5) {
            pcVar26 = "Multiple FXLC preshader blocks.";
            goto LAB_0010b7b2;
          }
        }
        else if (uVar2 == 0x49535250) {
          local_88 = ctabdata.have_ctab;
          local_90 = puVar1;
          bVar11 = true;
          if (bVar6) {
            pcVar26 = "Multiple PRSI preshader blocks.";
            goto LAB_0010b7b2;
          }
        }
        else {
          if (uVar2 != 0x42415443) {
            pcVar26 = "Bogus preshader section.";
            goto LAB_0010b7b2;
          }
          local_50 = ctabdata._0_8_ & 0xffffffff;
          puVar22 = puVar1;
          bVar9 = true;
          if (bVar32) {
            pcVar26 = "Multiple CTAB preshader blocks.";
            goto LAB_0010b7b2;
          }
        }
      }
      bVar7 = bVar12;
      bVar6 = bVar11;
      bVar5 = bVar10;
      bVar32 = bVar9;
      puVar29 = puVar29 + (ctabdata._0_8_ & 0xffffffff) + 1;
    }
    if (bVar32) {
      if (bVar5) {
        if (bVar7) {
          pMVar15 = (MOJOSHADER_preshader *)Malloc(ctx,0x58);
          if (pMVar15 == (MOJOSHADER_preshader *)0x0) {
            return;
          }
          pMVar15->malloc = (MOJOSHADER_malloc)0x0;
          pMVar15->free = (MOJOSHADER_free)0x0;
          *(undefined8 *)&pMVar15->register_count = 0;
          pMVar15->registers = (float *)0x0;
          *(undefined8 *)&pMVar15->instruction_count = 0;
          pMVar15->instructions = (MOJOSHADER_preshaderInstruction *)0x0;
          pMVar15->malloc_data = (void *)0x0;
          pMVar15->temp_count = 0;
          pMVar15->symbol_count = 0;
          pMVar15->symbols = (MOJOSHADER_symbol *)0x0;
          *(undefined8 *)pMVar15 = 0;
          pMVar15->literals = (double *)0x0;
          p_Var4 = ctx->free;
          pMVar15->malloc = ctx->malloc;
          pMVar15->free = p_Var4;
          pMVar15->malloc_data = ctx->malloc_data;
          ctx->preshader = pMVar15;
          if ((int)local_58 == 0) {
            fail(ctx,"Bogus CLIT block in preshader.");
          }
          else {
            uVar31 = local_60[1];
            if ((int)local_58 - 2U >> 1 < uVar31) {
              pcVar26 = "Bogus CLIT block in preshader.";
              goto LAB_0010b64e;
            }
            if (uVar31 != 0) {
              pMVar15->literal_count = uVar31;
              pdVar16 = (double *)Malloc(ctx,(ulong)uVar31 * 8);
              pMVar15->literals = pdVar16;
              if (pdVar16 == (double *)0x0) {
                return;
              }
              for (uVar23 = 0; uVar31 != uVar23; uVar23 = uVar23 + 1) {
                pdVar16[uVar23] = *(double *)(local_60 + uVar23 * 2 + 2);
              }
            }
          }
          if (bVar6) {
            if ((local_88 < 8) || (uVar23 = (ulong)local_90[7], local_88 - 8 < local_90[7] * 2 + 2))
            {
              pcVar26 = "Bogus preshader PRSI data";
              goto LAB_0010b64e;
            }
            local_90 = local_90 + 8;
          }
          else {
            uVar23 = 0;
            local_90 = (uint32 *)0x0;
          }
          ctabdata.have_ctab = 0;
          ctabdata.symbol_count = 0;
          ctabdata.symbols = (MOJOSHADER_symbol *)0x0;
          parse_constant_table(ctx,puVar22 + -1,(int)local_50 << 2,okay_version,0,&ctabdata);
          pMVar8 = ctabdata.symbols;
          iVar13 = ctabdata.symbol_count;
          pMVar15->symbol_count = ctabdata.symbol_count;
          pMVar15->symbols = ctabdata.symbols;
          if (ctabdata.have_ctab == 0) {
            pcVar26 = "Bogus preshader CTAB data";
          }
          else {
            uVar31 = local_68[1];
            uVar30 = (ulong)uVar31;
            pMVar15->instruction_count = uVar31;
            pMVar17 = (MOJOSHADER_preshaderInstruction *)Malloc(ctx,uVar30 * 0x70);
            pMVar15->instructions = pMVar17;
            if (pMVar17 == (MOJOSHADER_preshaderInstruction *)0x0) {
              return;
            }
            memset(pMVar17,0,uVar30 * 0x70);
            uVar27 = local_84 - 2;
            if (uVar31 <= uVar27 >> 1) {
              local_68 = local_68 + 2;
              pMVar17 = pMVar15->instructions;
              while( true ) {
                iVar28 = (int)uVar30;
                uVar30 = (ulong)(iVar28 - 1);
                if (iVar28 == 0) {
                  uVar31 = pMVar15->symbol_count;
                  pMVar15->temp_count = pMVar15->temp_count + 3 & 0xfffffffc;
                  puVar20 = &pMVar15->symbols->register_count;
                  uVar27 = 0;
                  while (bVar32 = uVar31 != 0, uVar31 = uVar31 - 1, bVar32) {
                    if (uVar27 < *puVar20 + puVar20[-1]) {
                      uVar27 = *puVar20 + puVar20[-1];
                    }
                    puVar20 = puVar20 + 0xe;
                  }
                  if (uVar27 == 0) {
                    return;
                  }
                  __s = (float *)Malloc(ctx,(ulong)uVar27 << 4);
                  pMVar15->registers = __s;
                  memset(__s,0,(ulong)uVar27 << 4);
                  pMVar15->register_count = uVar27;
                  return;
                }
                uVar31 = *local_68;
                uVar14 = uVar31 >> 0x10;
                MVar21 = MOJOSHADER_PRESHADEROP_MOV;
                if (uVar14 != 0x1000) {
                  if (uVar14 == 0xd020) {
                    MVar21 = MOJOSHADER_PRESHADEROP_NOISE_SCALAR;
                  }
                  else if (uVar14 == 0x1030) {
                    MVar21 = MOJOSHADER_PRESHADEROP_RCP;
                  }
                  else if (uVar14 == 0x1040) {
                    MVar21 = MOJOSHADER_PRESHADEROP_FRC;
                  }
                  else if (uVar14 == 0x1050) {
                    MVar21 = MOJOSHADER_PRESHADEROP_EXP;
                  }
                  else if (uVar14 == 0x1060) {
                    MVar21 = MOJOSHADER_PRESHADEROP_LOG;
                  }
                  else if (uVar14 == 0x1070) {
                    MVar21 = MOJOSHADER_PRESHADEROP_RSQ;
                  }
                  else if (uVar14 == 0x1080) {
                    MVar21 = MOJOSHADER_PRESHADEROP_SIN;
                  }
                  else if (uVar14 == 0x1090) {
                    MVar21 = MOJOSHADER_PRESHADEROP_COS;
                  }
                  else if (uVar14 == 0x10a0) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ASIN;
                  }
                  else if (uVar14 == 0x10b0) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ACOS;
                  }
                  else if (uVar14 == 0x10c0) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ATAN;
                  }
                  else if (uVar14 == 0x2000) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MIN;
                  }
                  else if (uVar14 == 0x2010) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MAX;
                  }
                  else if (uVar14 == 0x2020) {
                    MVar21 = MOJOSHADER_PRESHADEROP_LT;
                  }
                  else if (uVar14 == 0x2030) {
                    MVar21 = MOJOSHADER_PRESHADEROP_GE;
                  }
                  else if (uVar14 == 0x2040) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ADD;
                  }
                  else if (uVar14 == 0x2050) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MUL;
                  }
                  else if (uVar14 == 0x2060) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ATAN2;
                  }
                  else if (uVar14 == 0x2080) {
                    MVar21 = MOJOSHADER_PRESHADEROP_DIV;
                  }
                  else if (uVar14 == 0x3000) {
                    MVar21 = MOJOSHADER_PRESHADEROP_CMP;
                  }
                  else if (uVar14 == 0x3010) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MOVC;
                  }
                  else if (uVar14 == 0x5000) {
                    MVar21 = MOJOSHADER_PRESHADEROP_DOT;
                  }
                  else if (uVar14 == 0x5020) {
                    MVar21 = MOJOSHADER_PRESHADEROP_NOISE;
                  }
                  else if (uVar14 == 0xa000) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MIN_SCALAR;
                  }
                  else if (uVar14 == 0xa010) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MAX_SCALAR;
                  }
                  else if (uVar14 == 0xa020) {
                    MVar21 = MOJOSHADER_PRESHADEROP_LT_SCALAR;
                  }
                  else if (uVar14 == 0xa030) {
                    MVar21 = MOJOSHADER_PRESHADEROP_GE_SCALAR;
                  }
                  else if (uVar14 == 0xa040) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ADD_SCALAR;
                  }
                  else if (uVar14 == 0xa050) {
                    MVar21 = MOJOSHADER_PRESHADEROP_MUL_SCALAR;
                  }
                  else if (uVar14 == 0xa060) {
                    MVar21 = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR;
                  }
                  else if (uVar14 == 0xa080) {
                    MVar21 = MOJOSHADER_PRESHADEROP_DIV_SCALAR;
                  }
                  else if (uVar14 == 0xd000) {
                    MVar21 = MOJOSHADER_PRESHADEROP_DOT_SCALAR;
                  }
                  else if (uVar14 == 0x1010) {
                    MVar21 = MOJOSHADER_PRESHADEROP_NEG;
                  }
                  else {
                    fail(ctx,"Unknown preshader opcode.");
                    MVar21 = MOJOSHADER_PRESHADEROP_NOP;
                  }
                }
                uVar14 = local_68[1] + 1;
                pMVar17->opcode = MVar21;
                pMVar17->element_count = uVar31 & 0xff;
                pMVar17->operand_count = uVar14;
                uVar27 = uVar27 - 2;
                if (uVar27 < uVar14 * 3) break;
                local_68 = local_68 + 2;
                pMVar25 = pMVar17->operands;
                while (bVar32 = uVar14 != 0, uVar14 = uVar14 - 1, bVar32) {
                  uVar31 = local_68[2];
                  switch(local_68[1]) {
                  case 1:
                    if (pMVar15->literal_count < uVar31) {
                      pcVar26 = "Bogus preshader literal index.";
LAB_0010bd75:
                      fail(ctx,pcVar26);
                    }
                    else {
                      pMVar25->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                    }
                    break;
                  case 2:
                    uVar3 = *local_68;
                    puVar20 = &pMVar8->register_count;
                    iVar28 = iVar13;
                    while (iVar28 != 0) {
                      if (puVar20[-2] != MOJOSHADER_SYMREGSET_FLOAT4) {
                        __assert_fail("sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                      ,0x2ac8,
                                      "void parse_preshader(Context *, const uint32 *, uint32)");
                      }
                      if ((puVar20[-1] * 4 <= uVar31) && (uVar31 < (puVar20[-1] + *puVar20) * 4)) {
                        if (iVar28 != 0) {
                          pMVar25->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                          if (uVar3 != 0) {
                            pMVar25->array_register_count = uVar3;
                            puVar20 = (uint *)Malloc(ctx,(ulong)(uVar3 * 4));
                            pMVar25->array_registers = puVar20;
                            memset(puVar20,0,(ulong)(uVar3 * 4));
                            puVar20 = pMVar25->array_registers;
                            for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
                              puVar20[uVar18] = local_68[4] >> 2;
                              local_68 = local_68 + 2;
                            }
                            uVar27 = uVar27 + uVar3 * -2;
                          }
                          goto switchD_0010bc9c_caseD_3;
                        }
                        break;
                      }
                      puVar20 = puVar20 + 0xe;
                      iVar28 = iVar28 + -1;
                    }
                    fail(ctx,"Bogus preshader input index.");
                    break;
                  case 4:
                    pMVar25->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;
                    uVar24 = 1;
                    for (uVar18 = 0; uVar19 = uVar23, uVar23 != uVar18; uVar18 = uVar18 + 1) {
                      if ((local_90[(int)uVar24 - 1] * 4 <= uVar31) &&
                         (uVar19 = uVar18,
                         uVar31 < (local_90[(int)uVar24 - 1] + local_90[uVar24]) * 4)) break;
                      uVar24 = (ulong)((int)uVar24 + 2);
                    }
                    if ((bVar6) && ((int)uVar19 == (int)uVar23)) {
                      pcVar26 = "Bogus preshader output index.";
                      goto LAB_0010bd75;
                    }
                    break;
                  case 7:
                    pMVar25->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                    if (pMVar15->temp_count <= uVar31) {
                      pMVar15->temp_count = uVar31 + 1;
                    }
                  }
switchD_0010bc9c_caseD_3:
                  pMVar25->index = uVar31;
                  local_68 = local_68 + 3;
                  uVar27 = uVar27 - 3;
                  pMVar25 = pMVar25 + 1;
                }
                pMVar17 = pMVar17 + 1;
              }
            }
            pcVar26 = "Bogus preshader FXLC block.";
          }
LAB_0010b7b2:
          fail(ctx,pcVar26);
          return;
        }
        pcVar26 = "No CLIT block in preshader.";
      }
      else {
        pcVar26 = "No FXLC block in preshader.";
      }
    }
    else {
      pcVar26 = "No CTAB block in preshader.";
    }
  }
LAB_0010b64e:
  fail(ctx,pcVar26);
  return;
}

Assistant:

static void parse_preshader(Context *ctx, const uint32 *tokens, uint32 tokcount)
{
#ifndef MOJOSHADER_EFFECT_SUPPORT
    fail(ctx, "Preshader found, but effect support is disabled!");
#else
    uint32 i;

    assert(ctx->have_preshader == 0);  // !!! FIXME: can you have more than one?
    ctx->have_preshader = 1;

    // !!! FIXME: I don't know what specific versions signify, but we need to
    // !!! FIXME:  save this to test against the CTAB version field, if
    // !!! FIXME:  nothing else.
    // !!! FIXME: 0x02 0x0? is probably the version (fx_2_?),
    // !!! FIXME:  and 0x4658 is the magic, like a real shader's version token.
    const uint32 version_magic = 0x46580000;
    const uint32 min_version = 0x00000200 | version_magic;
    const uint32 max_version = 0x00000201 | version_magic;
    const uint32 version = SWAP32(tokens[0]);
    if (version < min_version || version > max_version)
    {
        fail(ctx, "Unsupported preshader version.");
        return;  // fail because the shader will malfunction w/o this.
    } // if

    tokens++;
    tokcount--;

    // All sections of a preshader are packed into separate comment tokens,
    //  inside the containing comment token block. Find them all before
    //  we start, so we don't care about the order they appear in the file.
    PreshaderBlockInfo ctab = { 0, 0, 0 };
    PreshaderBlockInfo prsi = { 0, 0, 0 };
    PreshaderBlockInfo fxlc = { 0, 0, 0 };
    PreshaderBlockInfo clit = { 0, 0, 0 };

    while (tokcount > 0)
    {
        uint32 subtokcount = 0;
        if ( (!is_comment_token(ctx, *tokens, &subtokcount)) ||
             (subtokcount > tokcount) )
        {
            fail(ctx, "Bogus preshader data.");
            return;
        } // if

        tokens++;
        tokcount--;

        const uint32 *nexttokens = tokens + subtokcount;
        const uint32 nexttokcount = tokcount - subtokcount;

        if (subtokcount > 0)
        {
            switch (SWAP32(*tokens))
            {
                #define PRESHADER_BLOCK_CASE(id, var) \
                    case id##_ID: { \
                        if (var.seen) { \
                            fail(ctx, "Multiple " #id " preshader blocks."); \
                            return; \
                        } \
                        var.tokens = tokens; \
                        var.tokcount = subtokcount; \
                        var.seen = 1; \
                        break; \
                    }
                PRESHADER_BLOCK_CASE(CTAB, ctab);
                PRESHADER_BLOCK_CASE(PRSI, prsi);
                PRESHADER_BLOCK_CASE(FXLC, fxlc);
                PRESHADER_BLOCK_CASE(CLIT, clit);
                default: fail(ctx, "Bogus preshader section."); return;
                #undef PRESHADER_BLOCK_CASE
            } // switch
        } // if

        tokens = nexttokens;
        tokcount = nexttokcount;
    } // while

    if (!ctab.seen) { fail(ctx, "No CTAB block in preshader."); return; }
    if (!fxlc.seen) { fail(ctx, "No FXLC block in preshader."); return; }
    if (!clit.seen) { fail(ctx, "No CLIT block in preshader."); return; }
    // prsi.seen is optional, apparently.

    MOJOSHADER_preshader *preshader = (MOJOSHADER_preshader *)
                                    Malloc(ctx, sizeof (MOJOSHADER_preshader));
    if (preshader == NULL)
        return;

    memset(preshader, '\0', sizeof (MOJOSHADER_preshader));
    preshader->malloc = ctx->malloc;
    preshader->free = ctx->free;
    preshader->malloc_data = ctx->malloc_data;

    ctx->preshader = preshader;

    // Let's set up the constant literals first...
    if (clit.tokcount == 0)
        fail(ctx, "Bogus CLIT block in preshader.");
    else
    {
        const uint32 lit_count = SWAP32(clit.tokens[1]);
        if (lit_count > ((clit.tokcount - 2) / 2))
        {
            fail(ctx, "Bogus CLIT block in preshader.");
            return;
        } // if
        else if (lit_count > 0)
        {
            preshader->literal_count = (unsigned int) lit_count;
            assert(sizeof (double) == 8);  // just in case.
            const size_t len = sizeof (double) * lit_count;
            preshader->literals = (double *) Malloc(ctx, len);
            if (preshader->literals == NULL)
                return;  // oh well.
            const double *litptr = (const double *) (clit.tokens + 2);
            for (i = 0; i < lit_count; i++)
                preshader->literals[i] = SWAPDBL(litptr[i]);
        } // else if
    } // else

    // Parse out the PRSI block. This is used to map the output registers.
    uint32 output_map_count = 0;
    const uint32 *output_map = NULL;
    if (prsi.seen)
    {
        if (prsi.tokcount < 8)
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        //const uint32 first_output_reg = SWAP32(prsi.tokens[1]);
        // !!! FIXME: there are a lot of fields here I don't know about.
        // !!! FIXME:  maybe [2] and [3] are for int4 and bool registers?
        //const uint32 output_reg_count = SWAP32(prsi.tokens[4]);
        // !!! FIXME:  maybe [5] and [6] are for int4 and bool registers?
        output_map_count = SWAP32(prsi.tokens[7]);

        prsi.tokcount -= 8;
        prsi.tokens += 8;

        if (prsi.tokcount < ((output_map_count + 1) * 2))
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        output_map = prsi.tokens;
    } // if

    // Now we'll figure out the CTAB...
    CtabData ctabdata = { 0, 0, 0 };
    parse_constant_table(ctx, ctab.tokens - 1, ctab.tokcount * 4,
                         version, 0, &ctabdata);

    // preshader owns this now. Don't free it in this function.
    preshader->symbol_count = ctabdata.symbol_count;
    preshader->symbols = ctabdata.symbols;

    if (!ctabdata.have_ctab)
    {
        fail(ctx, "Bogus preshader CTAB data");
        return;
    } // if

    // The FXLC block has the actual instructions...
    uint32 opcode_count = SWAP32(fxlc.tokens[1]);

    const size_t len = sizeof (MOJOSHADER_preshaderInstruction) * opcode_count;
    preshader->instruction_count = (unsigned int) opcode_count;
    preshader->instructions = (MOJOSHADER_preshaderInstruction *) Malloc(ctx, len);
    if (preshader->instructions == NULL)
        return;
    memset(preshader->instructions, '\0', len);

    fxlc.tokens += 2;
    fxlc.tokcount -= 2;
    if (opcode_count > (fxlc.tokcount / 2))
    {
        fail(ctx, "Bogus preshader FXLC block.");
        return;
    } // if

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    while (opcode_count--)
    {
        const uint32 opcodetok = SWAP32(fxlc.tokens[0]);
        MOJOSHADER_preshaderOpcode opcode = MOJOSHADER_PRESHADEROP_NOP;
        switch ((opcodetok >> 16) & 0xFFFF)
        {
            case 0x1000: opcode = MOJOSHADER_PRESHADEROP_MOV; break;
            case 0x1010: opcode = MOJOSHADER_PRESHADEROP_NEG; break;
            case 0x1030: opcode = MOJOSHADER_PRESHADEROP_RCP; break;
            case 0x1040: opcode = MOJOSHADER_PRESHADEROP_FRC; break;
            case 0x1050: opcode = MOJOSHADER_PRESHADEROP_EXP; break;
            case 0x1060: opcode = MOJOSHADER_PRESHADEROP_LOG; break;
            case 0x1070: opcode = MOJOSHADER_PRESHADEROP_RSQ; break;
            case 0x1080: opcode = MOJOSHADER_PRESHADEROP_SIN; break;
            case 0x1090: opcode = MOJOSHADER_PRESHADEROP_COS; break;
            case 0x10A0: opcode = MOJOSHADER_PRESHADEROP_ASIN; break;
            case 0x10B0: opcode = MOJOSHADER_PRESHADEROP_ACOS; break;
            case 0x10C0: opcode = MOJOSHADER_PRESHADEROP_ATAN; break;
            case 0x2000: opcode = MOJOSHADER_PRESHADEROP_MIN; break;
            case 0x2010: opcode = MOJOSHADER_PRESHADEROP_MAX; break;
            case 0x2020: opcode = MOJOSHADER_PRESHADEROP_LT; break;
            case 0x2030: opcode = MOJOSHADER_PRESHADEROP_GE; break;
            case 0x2040: opcode = MOJOSHADER_PRESHADEROP_ADD; break;
            case 0x2050: opcode = MOJOSHADER_PRESHADEROP_MUL; break;
            case 0x2060: opcode = MOJOSHADER_PRESHADEROP_ATAN2; break;
            case 0x2080: opcode = MOJOSHADER_PRESHADEROP_DIV; break;
            case 0x3000: opcode = MOJOSHADER_PRESHADEROP_CMP; break;
            case 0x3010: opcode = MOJOSHADER_PRESHADEROP_MOVC; break;
            case 0x5000: opcode = MOJOSHADER_PRESHADEROP_DOT; break;
            case 0x5020: opcode = MOJOSHADER_PRESHADEROP_NOISE; break;
            case 0xA000: opcode = MOJOSHADER_PRESHADEROP_MIN_SCALAR; break;
            case 0xA010: opcode = MOJOSHADER_PRESHADEROP_MAX_SCALAR; break;
            case 0xA020: opcode = MOJOSHADER_PRESHADEROP_LT_SCALAR; break;
            case 0xA030: opcode = MOJOSHADER_PRESHADEROP_GE_SCALAR; break;
            case 0xA040: opcode = MOJOSHADER_PRESHADEROP_ADD_SCALAR; break;
            case 0xA050: opcode = MOJOSHADER_PRESHADEROP_MUL_SCALAR; break;
            case 0xA060: opcode = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR; break;
            case 0xA080: opcode = MOJOSHADER_PRESHADEROP_DIV_SCALAR; break;
            case 0xD000: opcode = MOJOSHADER_PRESHADEROP_DOT_SCALAR; break;
            case 0xD020: opcode = MOJOSHADER_PRESHADEROP_NOISE_SCALAR; break;
            default: fail(ctx, "Unknown preshader opcode."); break;
        } // switch

        uint32 operand_count = SWAP32(fxlc.tokens[1]) + 1;  // +1 for dest.

        inst->opcode = opcode;
        inst->element_count = (unsigned int) (opcodetok & 0xFF);
        inst->operand_count = (unsigned int) operand_count;

        fxlc.tokens += 2;
        fxlc.tokcount -= 2;
        if ((operand_count * 3) > fxlc.tokcount)
        {
            fail(ctx, "Bogus preshader FXLC block.");
            return;
        } // if

        MOJOSHADER_preshaderOperand *operand = inst->operands;
        while (operand_count--)
        {
            const unsigned int item = (unsigned int) SWAP32(fxlc.tokens[2]);

            // !!! FIXME: Is this used anywhere other than INPUT? -flibit
            const uint32 numarrays = SWAP32(fxlc.tokens[0]);
            switch (SWAP32(fxlc.tokens[1]))
            {
                case 1:  // literal from CLIT block.
                {
                    if (item > preshader->literal_count)
                    {
                        fail(ctx, "Bogus preshader literal index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                    break;
                } // case

                case 2:  // item from ctabdata.
                {
                    MOJOSHADER_symbol *sym = ctabdata.symbols;
                    const uint32 symcount = (uint32) ctabdata.symbol_count;
                    for (i = 0; i < symcount; i++, sym++)
                    {
                        const uint32 base = sym->register_index * 4;
                        const uint32 count = sym->register_count * 4;
                        assert(sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4);
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for
                    if (i == ctabdata.symbol_count)
                    {
                        fail(ctx, "Bogus preshader input index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                    if (numarrays > 0)
                    {
                        // malloc the array symbol name array
                        const uint32 siz = numarrays * sizeof (uint32);
                        operand->array_register_count = numarrays;
                        operand->array_registers = (uint32 *) Malloc(ctx, siz);
                        memset(operand->array_registers, '\0', siz);
                        // Get each register base, indicating the arrays used.
                        // !!! FIXME: fail if fxlc.tokcount*2 > numarrays ?
                        for (i = 0; i < numarrays; i++)
                        {
                            const uint32 jmp = SWAP32(fxlc.tokens[4]);
                            const uint32 bigjmp = (jmp >> 4) * 4;
                            const uint32 ltljmp = (jmp >> 2) & 3;
                            operand->array_registers[i] = bigjmp + ltljmp;
                            fxlc.tokens += 2;
                            fxlc.tokcount -= 2;
                        } // for
                    } // if
                    break;
                } // case

                case 4:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;

                    for (i = 0; i < output_map_count; i++)
                    {
                        const uint32 base = output_map[(i*2)] * 4;
                        const uint32 count = output_map[(i*2)+1] * 4;
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for

                    if (i == output_map_count)
                    {
                        if (prsi.seen)  // No PRSI tokens, no output map.
                            fail(ctx, "Bogus preshader output index.");
                    } // if

                    break;
                } // case

                case 7:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                    if (item >= preshader->temp_count)
                        preshader->temp_count = item + 1;
                    break;
                } // case
            } // switch

            operand->index = item;

            fxlc.tokens += 3;
            fxlc.tokcount -= 3;
            operand++;
        } // while

        inst++;
    } // while

    // Registers need to be vec4, round up to nearest 4
    preshader->temp_count = (preshader->temp_count + 3) & ~3;

    unsigned int largest = 0;
    const MOJOSHADER_symbol *sym = preshader->symbols;
    const uint32 symcount = (uint32) preshader->symbol_count;
    for (i = 0; i < symcount; i++, sym++)
    {
        const unsigned int val = sym->register_index + sym->register_count;
        if (val > largest)
            largest = val;
    } // for

    if (largest > 0)
    {
        const size_t len = largest * sizeof (float) * 4;
        preshader->registers = (float *) Malloc(ctx, len);
        memset(preshader->registers, '\0', len);
        preshader->register_count = largest;
    } // if
#endif
}